

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase461::run(TestCase461 *this)

{
  PointerBuilder builder;
  PointerReader reader;
  Builder reader_00;
  Reader copyFrom;
  Reader reader_01;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ListSchema schema;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  Builder root2;
  undefined4 local_320;
  Orphanage local_318;
  Builder local_308;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  Orphan<capnp::DynamicList> orphan;
  Builder root1;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_290;
  Reader local_268;
  Reader local_228;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder1,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root1,&builder1.super_MessageBuilder);
  orphan.schema.elementType._0_8_ = root1._builder.segment;
  orphan.schema.elementType.field_4.schema = (RawBrandedSchema *)root1._builder.capTable;
  orphan.builder.tag.content = (uint64_t)root1._builder.pointers;
  root2._builder.segment = (SegmentBuilder *)0x220000000c;
  root2._builder.capTable._0_4_ = 0x38;
  builder.capTable = root1._builder.capTable;
  builder.segment = root1._builder.segment;
  builder.pointer = root1._builder.pointers;
  value.size_ = 3;
  value.ptr = (uint *)&root2;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder,value);
  local_318 = MessageBuilder::getOrphanage(&builder2.super_MessageBuilder);
  StructBuilder::asReader(&root1._builder);
  bVar1 = root2._builder.pointerCount != 0;
  local_308.builder.pointer = (WirePointer *)0x0;
  if (bVar1) {
    local_308.builder.pointer = root2._builder.pointers;
  }
  uStack_2f0 = 0x7fffffff;
  if (bVar1) {
    uStack_2f0 = local_320;
  }
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  if (bVar1) {
    uVar2 = root2._builder.segment._0_4_;
    uVar3 = root2._builder.segment._4_4_;
    uVar4 = root2._builder.capTable._0_4_;
    uVar5 = root2._builder.capTable._4_4_;
  }
  local_308.builder.segment = (SegmentBuilder *)CONCAT44(uVar3,uVar2);
  local_308.builder.capTable = (CapTableBuilder *)CONCAT44(uVar5,uVar4);
  schema = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
  reader._28_4_ = uStack_2ec;
  reader.nestingLimit = uStack_2f0;
  reader.capTable = &(local_308.builder.capTable)->super_CapTableReader;
  reader.segment = &(local_308.builder.segment)->super_SegmentReader;
  reader.pointer = local_308.builder.pointer;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_228,reader,schema);
  copyFrom.schema.elementType.field_4.schema = local_228.schema.elementType.field_4.schema;
  copyFrom.schema.elementType.baseType = local_228.schema.elementType.baseType;
  copyFrom.schema.elementType.listDepth = local_228.schema.elementType.listDepth;
  copyFrom.schema.elementType.isImplicitParam = local_228.schema.elementType.isImplicitParam;
  copyFrom.schema.elementType.field_3 = local_228.schema.elementType.field_3;
  copyFrom.schema.elementType._6_2_ = local_228.schema.elementType._6_2_;
  copyFrom.reader.segment = local_228.reader.segment;
  copyFrom.reader.capTable = local_228.reader.capTable;
  copyFrom.reader.ptr = local_228.reader.ptr;
  copyFrom.reader.elementCount = local_228.reader.elementCount;
  copyFrom.reader.step = local_228.reader.step;
  copyFrom.reader.structDataSize = local_228.reader.structDataSize;
  copyFrom.reader.structPointerCount = local_228.reader.structPointerCount;
  copyFrom.reader.elementSize = local_228.reader.elementSize;
  copyFrom.reader._39_1_ = local_228.reader._39_1_;
  copyFrom.reader.nestingLimit = local_228.reader.nestingLimit;
  copyFrom.reader._44_4_ = local_228.reader._44_4_;
  Orphanage::newOrphanCopy<capnp::DynamicList::Reader>(&orphan,&local_318,copyFrom);
  Orphan<capnp::DynamicList>::getReader(&local_268,&orphan);
  root2._builder.segment = (SegmentBuilder *)0x220000000c;
  root2._builder.capTable._0_4_ = 0x38;
  reader_01.schema.elementType.field_4.schema = local_268.schema.elementType.field_4.schema;
  reader_01.schema.elementType.baseType = local_268.schema.elementType.baseType;
  reader_01.schema.elementType.listDepth = local_268.schema.elementType.listDepth;
  reader_01.schema.elementType.isImplicitParam = local_268.schema.elementType.isImplicitParam;
  reader_01.schema.elementType.field_3 = local_268.schema.elementType.field_3;
  reader_01.schema.elementType._6_2_ = local_268.schema.elementType._6_2_;
  reader_01.reader.segment = local_268.reader.segment;
  reader_01.reader.capTable = local_268.reader.capTable;
  reader_01.reader.ptr = local_268.reader.ptr;
  reader_01.reader.elementCount = local_268.reader.elementCount;
  reader_01.reader.step = local_268.reader.step;
  reader_01.reader.structDataSize = local_268.reader.structDataSize;
  reader_01.reader.structPointerCount = local_268.reader.structPointerCount;
  reader_01.reader.elementSize = local_268.reader.elementSize;
  reader_01.reader._39_1_ = local_268.reader._39_1_;
  reader_01.reader.nestingLimit = local_268.reader.nestingLimit;
  reader_01.reader._44_4_ = local_268.reader._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&root2;
  checkList<unsigned_int,capnp::DynamicList::Reader>(reader_01,expected);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root2,&builder2.super_MessageBuilder);
  local_308.builder.capTable =
       (CapTableBuilder *)CONCAT44(root2._builder.capTable._4_4_,root2._builder.capTable._0_4_);
  local_308.builder.segment = root2._builder.segment;
  local_308.builder.pointer = root2._builder.pointers;
  AnyPointer::Builder::adopt<capnp::DynamicList>(&local_308,&orphan);
  local_308.builder.capTable =
       (CapTableBuilder *)CONCAT44(root2._builder.capTable._4_4_,root2._builder.capTable._0_4_);
  local_308.builder.segment = root2._builder.segment;
  local_308.builder.pointer = root2._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_290,&local_308);
  local_318.capTable._0_4_ = 0x38;
  local_318.arena = (BuilderArena *)0x220000000c;
  reader_00.builder.capTable = local_290.builder.capTable;
  reader_00.builder.segment = local_290.builder.segment;
  reader_00.builder.ptr = local_290.builder.ptr;
  reader_00.builder.elementCount = local_290.builder.elementCount;
  reader_00.builder.step = local_290.builder.step;
  reader_00.builder.structDataSize = local_290.builder.structDataSize;
  reader_00.builder.structPointerCount = local_290.builder.structPointerCount;
  reader_00.builder.elementSize = local_290.builder.elementSize;
  reader_00.builder._39_1_ = local_290.builder._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_00,expected_00);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::~MallocMessageBuilder(&builder1);
  return;
}

Assistant:

TEST(Orphans, OrphanageDynamicListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<test::TestAnyPointer>();
  root1.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});

  Orphan<DynamicList> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getAnyPointerField().getAs<DynamicList>(Schema::from<List<uint32_t>>()));
  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});

  auto root2 = builder2.initRoot<test::TestAnyPointer>();
  root2.getAnyPointerField().adopt(kj::mv(orphan));
  checkList(root2.getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});
}